

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O2

void __thiscall wasm::LocalGraphFlower::prepareLaziness(LocalGraphFlower *this)

{
  pointer ppEVar1;
  size_t __new_size;
  mapped_type *pmVar2;
  FlowBlock *block;
  FlowBlock *pFVar3;
  Index i;
  ulong uVar4;
  value_type local_50;
  LocalSet *set;
  FlowBlock *local_40;
  value_type local_38;
  LocalGet *get;
  
  prepareFlowBlocks(this);
  __new_size = Function::getNumLocals(this->func);
  std::
  vector<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
  ::resize(&this->getsByIndex,__new_size);
  set = (LocalSet *)&this->setsByIndex;
  std::
  vector<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
  ::resize((vector<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
            *)set,__new_size);
  local_40 = (this->flowBlocks).
             super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar3 = (this->flowBlocks).
                super__Vector_base<wasm::LocalGraphFlower::FlowBlock,_std::allocator<wasm::LocalGraphFlower::FlowBlock>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar3 != local_40; pFVar3 = pFVar3 + 1)
  {
    uVar4 = 0;
    while( true ) {
      ppEVar1 = (pFVar3->actions).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(pFVar3->actions).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) <= uVar4)
      break;
      local_38 = (value_type)ppEVar1[uVar4];
      if ((local_38->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id !=
          LocalGetId) {
        local_38 = (value_type)0x0;
      }
      if (local_38 == (value_type)0x0) {
        local_50 = (value_type)ppEVar1[uVar4];
        if ((local_50->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
            LocalSetId) {
          local_50 = (value_type)0x0;
        }
        if (local_50 != (value_type)0x0) {
          std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::push_back
                    ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                     ((ulong)local_50->index * 0x18 +
                     *(long *)&(set->super_SpecificExpression<(wasm::Expression::Id)9>).
                               super_Expression),&local_50);
        }
      }
      else {
        pmVar2 = std::__detail::
                 _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->getLocations,&local_38);
        pmVar2->first = pFVar3;
        pmVar2->second = (uint)uVar4;
        std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::push_back
                  ((this->getsByIndex).
                   super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_38->index,&local_38);
      }
      uVar4 = (ulong)((uint)uVar4 + 1);
    }
  }
  return;
}

Assistant:

void prepareLaziness() {
    prepareFlowBlocks();

    // Set up getLocations, getsByIndex, and setsByIndex.
    auto numLocals = func->getNumLocals();
    getsByIndex.resize(numLocals);
    setsByIndex.resize(numLocals);

    for (auto& block : flowBlocks) {
      const auto& actions = block.actions;
      for (Index i = 0; i < actions.size(); i++) {
        if (auto* get = actions[i]->dynCast<LocalGet>()) {
          getLocations[get] = BlockLocation{&block, i};
          getsByIndex[get->index].push_back(get);
        } else if (auto* set = actions[i]->dynCast<LocalSet>()) {
          setsByIndex[set->index].push_back(set);
        }
      }
    }
  }